

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

int cpu_restore_state_from_tb
              (CPUState *cpu,TranslationBlock_conflict *tb,uintptr_t searched_pc,_Bool reset_icount)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  int extraout_EAX;
  uint uVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  uint8_t *p;
  byte *pbVar9;
  target_long_conflict val;
  uint uVar10;
  target_ulong_conflict data [1];
  target_ulong_conflict local_3c;
  CPUTriCoreState *local_38;
  
  local_3c = tb->pc;
  pvVar6 = (tb->tc).ptr;
  uVar2 = tb->icount;
  if (uVar2 != 0 && pvVar6 <= (void *)(searched_pc - 2)) {
    local_38 = (CPUTriCoreState *)cpu->env_ptr;
    pbVar9 = (byte *)((long)pvVar6 + (tb->tc).size);
    uVar7 = 0;
    do {
      uVar4 = 0xfffffff9;
      uVar8 = 0;
      do {
        uVar4 = uVar4 + 7;
        bVar1 = *pbVar9;
        bVar3 = (byte)uVar4 & 0x1f;
        pbVar9 = pbVar9 + 1;
        uVar8 = uVar8 | (bVar1 & 0x7f) << bVar3;
      } while ((char)bVar1 < '\0');
      uVar10 = 0 << bVar3;
      uVar5 = -0x80 << ((byte)uVar4 & 0x1f);
      if (bVar1 < 0x40) {
        uVar5 = uVar10;
      }
      if (0x18 < uVar4) {
        uVar5 = uVar10;
      }
      local_3c = local_3c + (uVar8 | uVar5);
      uVar4 = 0xfffffff9;
      do {
        uVar4 = uVar4 + 7;
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar10 = uVar10 | (bVar1 & 0x7f) << ((byte)uVar4 & 0x1f);
      } while ((char)bVar1 < '\0');
      uVar8 = -0x80 << ((byte)uVar4 & 0x1f);
      if (bVar1 < 0x40) {
        uVar8 = 0;
      }
      if (0x18 < uVar4) {
        uVar8 = 0;
      }
      pvVar6 = (void *)((long)pvVar6 + (long)(int)(uVar10 | uVar8));
      if ((void *)(searched_pc - 2) < pvVar6) {
        if ((reset_icount) && ((tb->cflags & 0x20000) != 0)) {
          *(ushort *)(cpu[1].tb_jmp_cache + 0xe5) =
               *(short *)(cpu[1].tb_jmp_cache + 0xe5) + (uVar2 - (short)uVar7);
        }
        restore_state_to_opc_tricore(local_38,tb,&local_3c);
        return extraout_EAX;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  return (int)CONCAT71(in_register_00000009,reset_icount);
}

Assistant:

static int cpu_restore_state_from_tb(CPUState *cpu, TranslationBlock *tb,
                                     uintptr_t searched_pc, bool reset_icount)
{
    target_ulong data[TARGET_INSN_START_WORDS] = { tb->pc };
    uintptr_t host_pc = (uintptr_t)tb->tc.ptr;
    CPUArchState *env = cpu->env_ptr;
    uint8_t *p = (uint8_t *)tb->tc.ptr + tb->tc.size;
    int i, j, num_insns = tb->icount;

    searched_pc -= GETPC_ADJ;

    if (searched_pc < host_pc) {
        return -1;
    }

    /* Reconstruct the stored insn data while looking for the point at
       which the end of the insn exceeds the searched_pc.  */
    for (i = 0; i < num_insns; ++i) {
        for (j = 0; j < TARGET_INSN_START_WORDS; ++j) {
            data[j] += decode_sleb128(&p);
        }
        host_pc += decode_sleb128(&p);
        if (host_pc > searched_pc) {
            goto found;
        }
    }
    return -1;

 found:
    if (reset_icount && (tb_cflags(tb) & CF_USE_ICOUNT)) {
        /* Reset the cycle counter to the start of the block
           and shift if to the number of actually executed instructions */
        cpu_neg(cpu)->icount_decr.u16.low += num_insns - i;
    }
    restore_state_to_opc(env, tb, data);

    return 0;
}